

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O3

void __thiscall
google::protobuf::Map<google::protobuf::MapKey,_google::protobuf::MapValueRef>::InnerMap::erase
          (InnerMap *this,iterator it)

{
  void **ppvVar1;
  Node *item;
  bool bVar2;
  LogMessage *pLVar3;
  Node *pNVar4;
  size_type sVar5;
  size_type sVar6;
  ulong uVar7;
  LogFinisher local_61;
  TreeIterator local_60;
  LogMessage local_58;
  
  if (it.m_ != this) {
    internal::LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map.h"
               ,0x2d9);
    pLVar3 = internal::LogMessage::operator<<(&local_58,"CHECK failed: (it.m_) == (this): ");
    internal::LogFinisher::operator=((LogFinisher *)&local_60,pLVar3);
    internal::LogMessage::~LogMessage(&local_58);
  }
  local_60._M_node = (_Base_ptr)0x0;
  bVar2 = iterator_base<google::protobuf::MapPair<google::protobuf::MapKey,_google::protobuf::MapValueRef>_>
          ::revalidate_if_necessary(&it,&local_60);
  sVar6 = it.bucket_index_;
  item = it.node_;
  ppvVar1 = this->table_;
  pNVar4 = (Node *)ppvVar1[it.bucket_index_];
  if (bVar2) {
    if ((pNVar4 == (Node *)0x0) || (pNVar4 == (Node *)ppvVar1[it.bucket_index_ ^ 1])) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map.h"
                 ,0x2df);
      pLVar3 = internal::LogMessage::operator<<
                         (&local_58,"CHECK failed: TableEntryIsNonEmptyList(b): ");
      internal::LogFinisher::operator=(&local_61,pLVar3);
      internal::LogMessage::~LogMessage(&local_58);
      pNVar4 = (Node *)this->table_[sVar6];
    }
    pNVar4 = EraseFromLinkedList(this,item,pNVar4);
    sVar5 = sVar6;
  }
  else {
    if ((pNVar4 == (Node *)0x0) || (pNVar4 != (Node *)ppvVar1[it.bucket_index_ ^ 1])) {
      internal::LogMessage::LogMessage
                (&local_58,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/map.h"
                 ,0x2e4);
      pLVar3 = internal::LogMessage::operator<<(&local_58,"CHECK failed: TableEntryIsTree(b): ");
      internal::LogFinisher::operator=(&local_61,pLVar3);
      internal::LogMessage::~LogMessage(&local_58);
      pNVar4 = (Node *)this->table_[sVar6];
    }
    std::
    _Rb_tree<std::reference_wrapper<const_google::protobuf::MapKey>,_std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>,_std::less<google::protobuf::MapKey>,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
    ::_M_erase_aux((_Rb_tree<std::reference_wrapper<const_google::protobuf::MapKey>,_std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>,_std::less<google::protobuf::MapKey>,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
                    *)pNVar4,(const_iterator)local_60._M_node);
    if (*(long *)&pNVar4->field_0x30 != 0) goto LAB_003a8263;
    if ((this->alloc_).arena_ == (Arena *)0x0) {
      std::
      _Rb_tree<std::reference_wrapper<const_google::protobuf::MapKey>,_std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>,_std::less<google::protobuf::MapKey>,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
      ::~_Rb_tree((_Rb_tree<std::reference_wrapper<const_google::protobuf::MapKey>,_std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>,_std::_Select1st<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>,_std::less<google::protobuf::MapKey>,_google::protobuf::internal::MapAllocator<std::pair<const_std::reference_wrapper<const_google::protobuf::MapKey>,_void_*>_>_>
                   *)pNVar4);
      operator_delete(pNVar4);
    }
    sVar5 = sVar6 & 0xfffffffffffffffe;
    *(undefined8 *)((long)this->table_ + (sVar6 << 3 | 8)) = 0;
    pNVar4 = (Node *)0x0;
  }
  this->table_[sVar5] = pNVar4;
  sVar6 = sVar5;
LAB_003a8263:
  DestroyNode(this,item);
  this->num_elements_ = this->num_elements_ - 1;
  if ((sVar6 == this->index_of_first_non_null_) && (sVar6 < this->num_buckets_)) {
    do {
      uVar7 = sVar6 + 1;
      if (this->table_[sVar6] != (void *)0x0) {
        return;
      }
      this->index_of_first_non_null_ = uVar7;
      sVar6 = uVar7;
    } while (uVar7 != this->num_buckets_);
  }
  return;
}

Assistant:

void erase(iterator it) {
      GOOGLE_DCHECK_EQ(it.m_, this);
      typename Tree::iterator tree_it;
      const bool is_list = it.revalidate_if_necessary(&tree_it);
      size_type b = it.bucket_index_;
      Node* const item = it.node_;
      if (is_list) {
        GOOGLE_DCHECK(TableEntryIsNonEmptyList(b));
        Node* head = static_cast<Node*>(table_[b]);
        head = EraseFromLinkedList(item, head);
        table_[b] = static_cast<void*>(head);
      } else {
        GOOGLE_DCHECK(TableEntryIsTree(b));
        Tree* tree = static_cast<Tree*>(table_[b]);
        tree->erase(tree_it);
        if (tree->empty()) {
          // Force b to be the minimum of b and b ^ 1.  This is important
          // only because we want index_of_first_non_null_ to be correct.
          b &= ~static_cast<size_type>(1);
          DestroyTree(tree);
          table_[b] = table_[b + 1] = nullptr;
        }
      }
      DestroyNode(item);
      --num_elements_;
      if (PROTOBUF_PREDICT_FALSE(b == index_of_first_non_null_)) {
        while (index_of_first_non_null_ < num_buckets_ &&
               table_[index_of_first_non_null_] == nullptr) {
          ++index_of_first_non_null_;
        }
      }
    }